

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpprotocolhandler.cpp
# Opt level: O1

void __thiscall QHttpProtocolHandler::_q_readyRead(QHttpProtocolHandler *this)

{
  QHttpNetworkConnectionChannel *this_00;
  bool bVar1;
  SocketState SVar2;
  SocketError socketError;
  long lVar3;
  long in_FS_OFFSET;
  char c;
  anon_class_1_0_00000001 getState;
  anon_class_1_0_00000001 getError;
  undefined1 local_23;
  anon_class_1_0_00000001 local_22;
  anon_class_1_0_00000001 local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_22 = (anon_class_1_0_00000001)0xaa;
  SVar2 = QSocketAbstraction::
          visit<QSocketAbstraction::socketState(QIODevice*)::_lambda(auto:1*)_1_&>
                    (&local_22,(this->super_QAbstractProtocolHandler).m_socket);
  if (SVar2 == ConnectedState) {
    lVar3 = (**(code **)(*(long *)(this->super_QAbstractProtocolHandler).m_socket + 0xa0))();
    if (lVar3 == 0) {
      local_23 = 0xaa;
      lVar3 = QIODevice::peek((char *)(this->super_QAbstractProtocolHandler).m_socket,
                              (longlong)&local_23);
      if (lVar3 < 0) {
        this_00 = (this->super_QAbstractProtocolHandler).m_channel;
        local_21 = (anon_class_1_0_00000001)0xaa;
        socketError = QSocketAbstraction::
                      visit<QSocketAbstraction::socketError(QIODevice*)::_lambda(auto:1*)_1_&>
                                (&local_21,(this->super_QAbstractProtocolHandler).m_socket);
        QHttpNetworkConnectionChannel::_q_error
                  ((QHttpNetworkConnectionChannel *)this_00,socketError);
        if ((this->super_QAbstractProtocolHandler).m_reply != (QHttpNetworkReply *)0x0) {
          (*(this->super_QAbstractProtocolHandler)._vptr_QAbstractProtocolHandler[2])(this);
        }
        if (lVar3 < 0) goto LAB_00210e01;
      }
    }
  }
  bVar1 = QHttpNetworkConnectionChannel::isSocketWaiting
                    ((QHttpNetworkConnectionChannel *)
                     (this->super_QAbstractProtocolHandler).m_channel);
  if (!bVar1) {
    bVar1 = QHttpNetworkConnectionChannel::isSocketReading
                      ((QHttpNetworkConnectionChannel *)
                       (this->super_QAbstractProtocolHandler).m_channel);
    if (!bVar1) goto LAB_00210e01;
  }
  lVar3 = (**(code **)(*(long *)(this->super_QAbstractProtocolHandler).m_socket + 0xa0))();
  if (lVar3 != 0) {
    ((this->super_QAbstractProtocolHandler).m_channel)->state = ReadingState;
  }
  if ((this->super_QAbstractProtocolHandler).m_reply != (QHttpNetworkReply *)0x0) {
    (*(this->super_QAbstractProtocolHandler)._vptr_QAbstractProtocolHandler[2])(this);
  }
LAB_00210e01:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpProtocolHandler::_q_readyRead()
{
    if (QSocketAbstraction::socketState(m_socket) == QAbstractSocket::ConnectedState
        && m_socket->bytesAvailable() == 0) {
        // We got a readyRead but no bytes are available..
        // This happens for the Unbuffered QTcpSocket
        // Also check if socket is in ConnectedState since
        // this function may also be invoked via the event loop.
        char c;
        qint64  ret = m_socket->peek(&c, 1);
        if (ret < 0) {
            m_channel->_q_error(QSocketAbstraction::socketError(m_socket));
            // We still need to handle the reply so it emits its signals etc.
            if (m_reply)
                _q_receiveReply();
            return;
        }
    }

    if (m_channel->isSocketWaiting() || m_channel->isSocketReading()) {
        if (m_socket->bytesAvailable()) {
            // We might get a spurious call from readMoreLater()
            // call of the QHttpNetworkConnection even while the socket is disconnecting.
            // Therefore check if there is actually bytes available before changing the channel state.
            m_channel->state = QHttpNetworkConnectionChannel::ReadingState;
        }
        if (m_reply)
            _q_receiveReply();
    }
}